

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O1

void SUNBandMatrix_Print(SUNMatrix A,FILE *outfile)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long local_48;
  
  fputc(10,(FILE *)outfile);
  plVar1 = (long *)A->content;
  if (0 < *plVar1) {
    local_48 = 0;
    lVar2 = 0;
    do {
      lVar3 = lVar2 - plVar1[4];
      lVar5 = plVar1[1] + -1;
      if (plVar1[3] + lVar2 < plVar1[1]) {
        lVar5 = plVar1[3] + lVar2;
      }
      lVar6 = 0;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          fprintf((FILE *)outfile,"%12s  ","");
          lVar4 = lVar4 + 1;
          lVar6 = lVar3;
        } while (lVar4 < lVar3);
      }
      if (lVar6 <= lVar5) {
        if (lVar3 < 1) {
          lVar3 = 0;
        }
        lVar6 = lVar3 + -1;
        lVar3 = local_48 + lVar3 * -8;
        do {
          fprintf((FILE *)outfile,"% .15e  ",
                  *(undefined8 *)
                   (lVar3 + *(long *)((long)A->content + 0x28) * 8 +
                            *(long *)(*(long *)((long)A->content + 0x40) + 8 + lVar6 * 8)));
          lVar6 = lVar6 + 1;
          lVar3 = lVar3 + -8;
        } while (lVar6 < lVar5);
      }
      fputc(10,(FILE *)outfile);
      lVar2 = lVar2 + 1;
      plVar1 = (long *)A->content;
      local_48 = local_48 + 8;
    } while (lVar2 < *plVar1);
  }
  return;
}

Assistant:

void SUNBandMatrix_Print(SUNMatrix A, FILE* outfile)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, start, finish;

  SUNAssertVoid(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);

  /* perform operation */
  fprintf(outfile, "\n");
  for (i = 0; i < SM_ROWS_B(A); i++)
  {
    start  = SUNMAX(0, i - SM_LBAND_B(A));
    finish = SUNMIN(SM_COLUMNS_B(A) - 1, i + SM_UBAND_B(A));
    for (j = 0; j < start; j++) { fprintf(outfile, "%12s  ", ""); }
    for (j = start; j <= finish; j++)
    {
      fprintf(outfile, SUN_FORMAT_E "  ", SM_ELEMENT_B(A, i, j));
    }
    fprintf(outfile, "\n");
  }
  return;
}